

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_symboltable.c
# Opt level: O2

symboltable_t * symboltable_create(symtable_tag tag)

{
  symboltable_t *psVar1;
  gravity_hash_t *pgVar2;
  ghash_r *pgVar3;
  gravity_hash_t **ppgVar4;
  code *free_fn;
  
  psVar1 = (symboltable_t *)gravity_calloc((gravity_vm *)0x0,1,0x18);
  free_fn = symboltable_hash_free;
  if (tag == SYMTABLE_TAG_ENUM) {
    free_fn = symboltable_keyvalue_free;
  }
  pgVar2 = gravity_hash_create(0,gravity_value_hash,gravity_value_equals,free_fn,(void *)0x0);
  if (psVar1 != (symboltable_t *)0x0) {
    psVar1->tag = tag;
    psVar1->count1 = 0;
    psVar1->count2 = 0;
    psVar1->count3 = 0;
    pgVar3 = (ghash_r *)gravity_calloc((gravity_vm *)0x0,1,0x18);
    psVar1->stack = pgVar3;
    pgVar3->m = 8;
    ppgVar4 = (gravity_hash_t **)malloc(0x40);
    pgVar3->p = ppgVar4;
    pgVar3->n = 1;
    *ppgVar4 = pgVar2;
  }
  return psVar1;
}

Assistant:

symboltable_t *symboltable_create (symtable_tag tag) {
    bool is_enum = (tag == SYMTABLE_TAG_ENUM);
    
    symboltable_t    *table = mem_alloc(NULL, sizeof(symboltable_t));
    gravity_hash_t    *hash = gravity_hash_create(0, gravity_value_hash, gravity_value_equals,
                                                (is_enum) ? symboltable_keyvalue_free : symboltable_hash_free, NULL);
    if (!table) return NULL;

    // init symbol table
    table->tag = tag;
    table->count1 = 0;
    table->count2 = 0;
    table->count3 = 0;
    table->stack = mem_alloc(NULL, sizeof(ghash_r));
    scope_stack_init(table->stack);
    scope_stack_push(table->stack, hash);

    return table;
}